

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_protocol_change_state(ENetHost *host,ENetPeer *peer,ENetPeerState state)

{
  if ((int)peer - 5U < 2) {
    enet_peer_on_connect((ENetPeer *)host);
  }
  else {
    enet_peer_on_disconnect((ENetPeer *)host);
  }
  *(int *)&host->peerCount = (int)peer;
  return;
}

Assistant:

static void enet_protocol_change_state(ENetHost* host, ENetPeer* peer, ENetPeerState state) {
	if (state == ENET_PEER_STATE_CONNECTED || state == ENET_PEER_STATE_DISCONNECT_LATER)
		enet_peer_on_connect(peer);
	else
		enet_peer_on_disconnect(peer);

	peer->state = state;
}